

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int __thiscall ncnn::LSTM::forward(LSTM *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _h;
  int iVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  void *__src;
  void *__dest;
  Mat m_3;
  Mat m_2;
  Mat m_11;
  Mat m_10;
  Mat m_1;
  Mat m;
  Mat local_c8;
  Mat local_78;
  
  _h = bottom_blob->h;
  iVar1 = this->direction;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,this->num_output,4,opt->workspace_allocator);
  iVar4 = -100;
  if (local_78.data == (void *)0x0) goto LAB_00320334;
  if (local_78.cstep * (long)local_78.c == 0) goto LAB_00320334;
  uVar6 = (int)local_78.cstep * local_78.c;
  uVar7 = 0;
  uVar5 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar5 = uVar7;
  }
  for (; (int)uVar5 != (int)uVar7; uVar7 = uVar7 + 1) {
    *(undefined4 *)((long)local_78.data + uVar7 * 4) = 0;
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,this->hidden_size,4,opt->workspace_allocator);
  iVar4 = -100;
  if (local_c8.data != (void *)0x0) {
    if (local_c8.cstep * (long)local_c8.c != 0) {
      uVar6 = (int)local_c8.cstep * local_c8.c;
      uVar7 = 0;
      uVar5 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar5 = uVar7;
      }
      for (; (int)uVar5 != (int)uVar7; uVar7 = uVar7 + 1) {
        *(undefined4 *)((long)local_c8.data + uVar7 * 4) = 0;
      }
      Mat::create(top_blob,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar6 = this->direction;
        if (uVar6 < 2) {
          if (this->int8_scale_term == 0) {
            m.w = (this->weight_xc_data).w;
            m.h = (this->weight_xc_data).h;
            m.data = (this->weight_xc_data).data;
            uVar5 = (this->weight_xc_data).elemsize;
            m.elempack = (this->weight_xc_data).elempack;
            m.allocator = (this->weight_xc_data).allocator;
            m.refcount._0_4_ = 0;
            m.refcount._4_4_ = 0;
            m.elemsize._0_4_ = (undefined4)uVar5;
            m.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
            m.c = (this->weight_xc_data).d;
            m.d = 1;
            iVar1 = (this->weight_xc_data).dims;
            m.dims = iVar1 + -1;
            m.cstep = (uVar5 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar5;
            if (iVar1 == 4) {
              m.cstep = (long)m.h * (long)m.w;
            }
            m_1.w = (this->bias_c_data).w;
            m_1.h = (this->bias_c_data).h;
            m_1.data = (this->bias_c_data).data;
            uVar5 = (this->bias_c_data).elemsize;
            m_1.elempack = (this->bias_c_data).elempack;
            m_1.allocator = (this->bias_c_data).allocator;
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize._0_4_ = (undefined4)uVar5;
            m_1.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
            m_1.c = (this->bias_c_data).d;
            m_1.d = 1;
            iVar1 = (this->bias_c_data).dims;
            m_1.dims = iVar1 + -1;
            m_1.cstep = (uVar5 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar5;
            if (iVar1 == 4) {
              m_1.cstep = (long)m_1.h * (long)m_1.w;
            }
            m_2.w = (this->weight_hc_data).w;
            m_2.h = (this->weight_hc_data).h;
            m_2.c = (this->weight_hc_data).d;
            m_2.data = (this->weight_hc_data).data;
            m_2.elemsize = (this->weight_hc_data).elemsize;
            m_2.elempack = (this->weight_hc_data).elempack;
            m_2.allocator = (this->weight_hc_data).allocator;
            m_2.refcount = (int *)0x0;
            m_2.d = 1;
            iVar1 = (this->weight_hc_data).dims;
            m_2.dims = iVar1 + -1;
            m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                        m_2.elemsize;
            if (iVar1 == 4) {
              m_2.cstep = (long)m_2.h * (long)m_2.w;
            }
            if (this->num_output == this->hidden_size) {
              m_3.cstep = 0;
              m_3.data = (void *)0x0;
              m_3.elemsize._0_4_ = 0;
              m_3.elemsize._4_4_ = 0;
              m_3.elempack = 0;
              m_3.allocator = (Allocator *)0x0;
              m_3.dims = 0;
              m_3.w = 0;
              m_3.h = 0;
              m_3.d = 0;
              m_3.c = 0;
            }
            else {
              m_3.w = (this->weight_hr_data).w;
              m_3.h = (this->weight_hr_data).h;
              m_3.data = (this->weight_hr_data).data;
              uVar5 = (this->weight_hr_data).elemsize;
              m_3.elempack = (this->weight_hr_data).elempack;
              m_3.allocator = (this->weight_hr_data).allocator;
              m_3.elemsize._0_4_ = (undefined4)uVar5;
              m_3.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
              m_3.c = (this->weight_hr_data).d;
              m_3.d = 1;
              iVar1 = (this->weight_hr_data).dims;
              m_3.dims = iVar1 + -1;
              m_3.cstep = (uVar5 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar5;
              if (iVar1 == 4) {
                m_3.cstep = (long)m_3.h * (long)m_3.w;
              }
            }
            m_3.refcount._4_4_ = 0;
            m_3.refcount._0_4_ = 0;
            iVar4 = lstm(bottom_blob,top_blob,uVar6,&m,&m_1,&m_2,&m_3,&local_78,&local_c8,opt);
          }
          else {
            m.w = (this->weight_xc_data).w;
            m.h = (this->weight_xc_data).h;
            m.data = (this->weight_xc_data).data;
            uVar5 = (this->weight_xc_data).elemsize;
            m.elempack = (this->weight_xc_data).elempack;
            m.allocator = (this->weight_xc_data).allocator;
            m.refcount._0_4_ = 0;
            m.refcount._4_4_ = 0;
            m.elemsize._0_4_ = (undefined4)uVar5;
            m.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
            m.c = (this->weight_xc_data).d;
            m.d = 1;
            iVar1 = (this->weight_xc_data).dims;
            m.dims = iVar1 + -1;
            m.cstep = (uVar5 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar5;
            if (iVar1 == 4) {
              m.cstep = (long)m.h * (long)m.w;
            }
            m_1.w = (this->bias_c_data).w;
            m_1.h = (this->bias_c_data).h;
            m_1.data = (this->bias_c_data).data;
            uVar5 = (this->bias_c_data).elemsize;
            m_1.elempack = (this->bias_c_data).elempack;
            m_1.allocator = (this->bias_c_data).allocator;
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize._0_4_ = (undefined4)uVar5;
            m_1.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
            m_1.c = (this->bias_c_data).d;
            m_1.d = 1;
            iVar1 = (this->bias_c_data).dims;
            m_1.dims = iVar1 + -1;
            m_1.cstep = (uVar5 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar5;
            if (iVar1 == 4) {
              m_1.cstep = (long)m_1.h * (long)m_1.w;
            }
            m_2.w = (this->weight_hc_data).w;
            m_2.h = (this->weight_hc_data).h;
            m_2.c = (this->weight_hc_data).d;
            m_2.data = (this->weight_hc_data).data;
            m_2.elemsize = (this->weight_hc_data).elemsize;
            m_2.elempack = (this->weight_hc_data).elempack;
            m_2.allocator = (this->weight_hc_data).allocator;
            m_2.refcount = (int *)0x0;
            m_2.d = 1;
            iVar1 = (this->weight_hc_data).dims;
            m_2.dims = iVar1 + -1;
            m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                        m_2.elemsize;
            if (iVar1 == 4) {
              m_2.cstep = (long)m_2.h * (long)m_2.w;
            }
            if (this->num_output == this->hidden_size) {
              m_3.cstep = 0;
              m_3.data = (void *)0x0;
              m_3.elemsize._0_4_ = 0;
              m_3.elemsize._4_4_ = 0;
              m_3.elempack = 0;
              m_3.allocator = (Allocator *)0x0;
              m_3.dims = 0;
              m_3.w = 0;
              m_3.h = 0;
              m_3.d = 0;
              m_3.c = 0;
            }
            else {
              m_3.w = (this->weight_hr_data).w;
              m_3.h = (this->weight_hr_data).h;
              m_3.data = (this->weight_hr_data).data;
              uVar5 = (this->weight_hr_data).elemsize;
              m_3.elempack = (this->weight_hr_data).elempack;
              m_3.allocator = (this->weight_hr_data).allocator;
              m_3.elemsize._0_4_ = (undefined4)uVar5;
              m_3.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
              m_3.c = (this->weight_hr_data).d;
              m_3.d = 1;
              iVar1 = (this->weight_hr_data).dims;
              m_3.dims = iVar1 + -1;
              m_3.cstep = (uVar5 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar5;
              if (iVar1 == 4) {
                m_3.cstep = (long)m_3.h * (long)m_3.w;
              }
            }
            m_3.refcount._4_4_ = 0;
            m_3.refcount._0_4_ = 0;
            iVar4 = lstm_int8(bottom_blob,top_blob,uVar6,&m,
                              (float *)(this->weight_xc_data_int8_scales).data,&m_1,&m_2,
                              (float *)(this->weight_hc_data_int8_scales).data,&m_3,&local_78,
                              &local_c8,opt);
          }
          if (iVar4 != 0) goto LAB_003202fd;
          uVar6 = this->direction;
        }
        if (uVar6 == 2) {
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.allocator = (Allocator *)0x0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
          iVar4 = -100;
          if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
            bVar3 = false;
          }
          else {
            m_1.cstep = 0;
            m_1.data = (void *)0x0;
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize._0_4_ = 0;
            m_1.elemsize._4_4_ = 0;
            m_1.elempack = 0;
            m_1.allocator = (Allocator *)0x0;
            m_1.dims = 0;
            m_1.w = 0;
            m_1.h = 0;
            m_1.d = 0;
            m_1.c = 0;
            Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
            iVar4 = -100;
            if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
LAB_00320ee7:
              bVar3 = false;
            }
            else {
              if (this->int8_scale_term == 0) {
                m_2.w = (this->weight_xc_data).w;
                m_2.h = (this->weight_xc_data).h;
                m_2.c = (this->weight_xc_data).d;
                m_2.data = (this->weight_xc_data).data;
                m_2.elemsize = (this->weight_xc_data).elemsize;
                m_2.elempack = (this->weight_xc_data).elempack;
                m_2.allocator = (this->weight_xc_data).allocator;
                m_2.refcount = (int *)0x0;
                m_2.d = 1;
                iVar1 = (this->weight_xc_data).dims;
                m_2.dims = iVar1 + -1;
                m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                            m_2.elemsize;
                if (iVar1 == 4) {
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                }
                m_3.w = (this->bias_c_data).w;
                m_3.h = (this->bias_c_data).h;
                m_3.data = (this->bias_c_data).data;
                uVar5 = (this->bias_c_data).elemsize;
                m_3.elempack = (this->bias_c_data).elempack;
                m_3.allocator = (this->bias_c_data).allocator;
                m_3.refcount._0_4_ = 0;
                m_3.refcount._4_4_ = 0;
                m_3.elemsize._0_4_ = (undefined4)uVar5;
                m_3.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
                m_3.c = (this->bias_c_data).d;
                m_3.d = 1;
                iVar1 = (this->bias_c_data).dims;
                m_3.dims = iVar1 + -1;
                m_3.cstep = (uVar5 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar5;
                if (iVar1 == 4) {
                  m_3.cstep = (long)m_3.h * (long)m_3.w;
                }
                m_10.w = (this->weight_hc_data).w;
                m_10.h = (this->weight_hc_data).h;
                m_10.c = (this->weight_hc_data).d;
                m_10.data = (this->weight_hc_data).data;
                m_10.elemsize = (this->weight_hc_data).elemsize;
                m_10.elempack = (this->weight_hc_data).elempack;
                m_10.allocator = (this->weight_hc_data).allocator;
                m_10.refcount = (int *)0x0;
                m_10.d = 1;
                iVar1 = (this->weight_hc_data).dims;
                m_10.dims = iVar1 + -1;
                m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0
                             ) / m_10.elemsize;
                if (iVar1 == 4) {
                  m_10.cstep = (long)m_10.h * (long)m_10.w;
                }
                if (this->num_output == this->hidden_size) {
                  m_11.cstep = 0;
                  m_11.data = (void *)0x0;
                  m_11.elemsize._0_4_ = 0;
                  m_11.elemsize._4_4_ = 0;
                  m_11.elempack = 0;
                  m_11.allocator = (Allocator *)0x0;
                  m_11.dims = 0;
                  m_11.w = 0;
                  m_11.h = 0;
                  m_11.d = 0;
                  m_11.c = 0;
                }
                else {
                  m_11.w = (this->weight_hr_data).w;
                  m_11.h = (this->weight_hr_data).h;
                  m_11.data = (this->weight_hr_data).data;
                  uVar5 = (this->weight_hr_data).elemsize;
                  m_11.elempack = (this->weight_hr_data).elempack;
                  m_11.allocator = (this->weight_hr_data).allocator;
                  m_11.elemsize._0_4_ = (undefined4)uVar5;
                  m_11.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
                  m_11.c = (this->weight_hr_data).d;
                  m_11.d = 1;
                  iVar1 = (this->weight_hr_data).dims;
                  m_11.dims = iVar1 + -1;
                  m_11.cstep = (uVar5 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) /
                               uVar5;
                  if (iVar1 == 4) {
                    m_11.cstep = (long)m_11.h * (long)m_11.w;
                  }
                }
                m_11.refcount._4_4_ = 0;
                m_11.refcount._0_4_ = 0;
                iVar4 = lstm(bottom_blob,&m,0,&m_2,&m_3,&m_10,&m_11,&local_78,&local_c8,opt);
              }
              else {
                m_2.w = (this->weight_xc_data).w;
                m_2.h = (this->weight_xc_data).h;
                m_2.c = (this->weight_xc_data).d;
                m_2.data = (this->weight_xc_data).data;
                m_2.elemsize = (this->weight_xc_data).elemsize;
                m_2.elempack = (this->weight_xc_data).elempack;
                m_2.allocator = (this->weight_xc_data).allocator;
                m_2.refcount = (int *)0x0;
                m_2.d = 1;
                iVar1 = (this->weight_xc_data).dims;
                m_2.dims = iVar1 + -1;
                m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                            m_2.elemsize;
                if (iVar1 == 4) {
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                }
                m_3.w = (this->bias_c_data).w;
                m_3.h = (this->bias_c_data).h;
                m_3.data = (this->bias_c_data).data;
                uVar5 = (this->bias_c_data).elemsize;
                m_3.elempack = (this->bias_c_data).elempack;
                m_3.allocator = (this->bias_c_data).allocator;
                m_3.refcount._0_4_ = 0;
                m_3.refcount._4_4_ = 0;
                m_3.elemsize._0_4_ = (undefined4)uVar5;
                m_3.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
                m_3.c = (this->bias_c_data).d;
                m_3.d = 1;
                iVar1 = (this->bias_c_data).dims;
                m_3.dims = iVar1 + -1;
                m_3.cstep = (uVar5 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar5;
                if (iVar1 == 4) {
                  m_3.cstep = (long)m_3.h * (long)m_3.w;
                }
                m_10.w = (this->weight_hc_data).w;
                m_10.h = (this->weight_hc_data).h;
                m_10.c = (this->weight_hc_data).d;
                m_10.data = (this->weight_hc_data).data;
                m_10.elemsize = (this->weight_hc_data).elemsize;
                m_10.elempack = (this->weight_hc_data).elempack;
                m_10.allocator = (this->weight_hc_data).allocator;
                m_10.refcount = (int *)0x0;
                m_10.d = 1;
                iVar1 = (this->weight_hc_data).dims;
                m_10.dims = iVar1 + -1;
                m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0
                             ) / m_10.elemsize;
                if (iVar1 == 4) {
                  m_10.cstep = (long)m_10.h * (long)m_10.w;
                }
                if (this->num_output == this->hidden_size) {
                  m_11.cstep = 0;
                  m_11.data = (void *)0x0;
                  m_11.elemsize._0_4_ = 0;
                  m_11.elemsize._4_4_ = 0;
                  m_11.elempack = 0;
                  m_11.allocator = (Allocator *)0x0;
                  m_11.dims = 0;
                  m_11.w = 0;
                  m_11.h = 0;
                  m_11.d = 0;
                  m_11.c = 0;
                }
                else {
                  m_11.w = (this->weight_hr_data).w;
                  m_11.h = (this->weight_hr_data).h;
                  m_11.data = (this->weight_hr_data).data;
                  uVar5 = (this->weight_hr_data).elemsize;
                  m_11.elempack = (this->weight_hr_data).elempack;
                  m_11.allocator = (this->weight_hr_data).allocator;
                  m_11.elemsize._0_4_ = (undefined4)uVar5;
                  m_11.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
                  m_11.c = (this->weight_hr_data).d;
                  m_11.d = 1;
                  iVar1 = (this->weight_hr_data).dims;
                  m_11.dims = iVar1 + -1;
                  m_11.cstep = (uVar5 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) /
                               uVar5;
                  if (iVar1 == 4) {
                    m_11.cstep = (long)m_11.h * (long)m_11.w;
                  }
                }
                m_11.refcount._4_4_ = 0;
                m_11.refcount._0_4_ = 0;
                iVar4 = lstm_int8(bottom_blob,&m,0,&m_2,
                                  (float *)(this->weight_xc_data_int8_scales).data,&m_3,&m_10,
                                  (float *)(this->weight_hc_data_int8_scales).data,&m_11,&local_78,
                                  &local_c8,opt);
              }
              if (iVar4 != 0) goto LAB_00320ee7;
              uVar7 = 0;
              uVar5 = (ulong)(uint)(local_78.c * (int)local_78.cstep);
              if (local_78.c * (int)local_78.cstep < 1) {
                uVar5 = uVar7;
              }
              for (; (int)uVar5 != (int)uVar7; uVar7 = uVar7 + 1) {
                *(undefined4 *)((long)local_78.data + uVar7 * 4) = 0;
              }
              uVar7 = 0;
              uVar5 = (ulong)(uint)(local_c8.c * (int)local_c8.cstep);
              if (local_c8.c * (int)local_c8.cstep < 1) {
                uVar5 = uVar7;
              }
              for (; (int)uVar5 != (int)uVar7; uVar7 = uVar7 + 1) {
                *(undefined4 *)((long)local_c8.data + uVar7 * 4) = 0;
              }
              if (this->int8_scale_term == 0) {
                m_2.w = (this->weight_xc_data).w;
                m_2.h = (this->weight_xc_data).h;
                m_2.elemsize = (this->weight_xc_data).elemsize;
                m_2.data = (void *)((this->weight_xc_data).cstep * m_2.elemsize +
                                   (long)(this->weight_xc_data).data);
                m_2.c = (this->weight_xc_data).d;
                m_2.elempack = (this->weight_xc_data).elempack;
                m_2.allocator = (this->weight_xc_data).allocator;
                m_2.refcount = (int *)0x0;
                m_2.d = 1;
                iVar1 = (this->weight_xc_data).dims;
                m_2.dims = iVar1 + -1;
                m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                            m_2.elemsize;
                if (iVar1 == 4) {
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                }
                m_3.w = (this->bias_c_data).w;
                m_3.h = (this->bias_c_data).h;
                uVar5 = (this->bias_c_data).elemsize;
                m_3.data = (void *)((this->bias_c_data).cstep * uVar5 +
                                   (long)(this->bias_c_data).data);
                m_3.elempack = (this->bias_c_data).elempack;
                m_3.allocator = (this->bias_c_data).allocator;
                m_3.refcount._0_4_ = 0;
                m_3.refcount._4_4_ = 0;
                m_3.elemsize._0_4_ = (undefined4)uVar5;
                m_3.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
                m_3.c = (this->bias_c_data).d;
                m_3.d = 1;
                iVar1 = (this->bias_c_data).dims;
                m_3.dims = iVar1 + -1;
                m_3.cstep = (uVar5 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar5;
                if (iVar1 == 4) {
                  m_3.cstep = (long)m_3.h * (long)m_3.w;
                }
                m_10.w = (this->weight_hc_data).w;
                m_10.h = (this->weight_hc_data).h;
                m_10.elemsize = (this->weight_hc_data).elemsize;
                m_10.data = (void *)((this->weight_hc_data).cstep * m_10.elemsize +
                                    (long)(this->weight_hc_data).data);
                m_10.c = (this->weight_hc_data).d;
                m_10.elempack = (this->weight_hc_data).elempack;
                m_10.allocator = (this->weight_hc_data).allocator;
                m_10.refcount = (int *)0x0;
                m_10.d = 1;
                iVar1 = (this->weight_hc_data).dims;
                m_10.dims = iVar1 + -1;
                m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0
                             ) / m_10.elemsize;
                if (iVar1 == 4) {
                  m_10.cstep = (long)m_10.h * (long)m_10.w;
                }
                if (this->num_output == this->hidden_size) {
                  m_11.cstep = 0;
                  m_11.data = (void *)0x0;
                  m_11.elemsize._0_4_ = 0;
                  m_11.elemsize._4_4_ = 0;
                  m_11.elempack = 0;
                  m_11.allocator = (Allocator *)0x0;
                  m_11.dims = 0;
                  m_11.w = 0;
                  m_11.h = 0;
                  m_11.d = 0;
                  m_11.c = 0;
                }
                else {
                  m_11.w = (this->weight_hr_data).w;
                  m_11.h = (this->weight_hr_data).h;
                  uVar5 = (this->weight_hr_data).elemsize;
                  m_11.data = (void *)((this->weight_hr_data).cstep * uVar5 +
                                      (long)(this->weight_hr_data).data);
                  m_11.elempack = (this->weight_hr_data).elempack;
                  m_11.allocator = (this->weight_hr_data).allocator;
                  m_11.elemsize._0_4_ = (undefined4)uVar5;
                  m_11.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
                  m_11.c = (this->weight_hr_data).d;
                  m_11.d = 1;
                  iVar1 = (this->weight_hr_data).dims;
                  m_11.dims = iVar1 + -1;
                  m_11.cstep = (uVar5 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) /
                               uVar5;
                  if (iVar1 == 4) {
                    m_11.cstep = (long)m_11.h * (long)m_11.w;
                  }
                }
                m_11.refcount._4_4_ = 0;
                m_11.refcount._0_4_ = 0;
                iVar4 = lstm(bottom_blob,&m_1,1,&m_2,&m_3,&m_10,&m_11,&local_78,&local_c8,opt);
              }
              else {
                m_2.w = (this->weight_xc_data).w;
                m_2.h = (this->weight_xc_data).h;
                m_2.elemsize = (this->weight_xc_data).elemsize;
                m_2.data = (void *)((this->weight_xc_data).cstep * m_2.elemsize +
                                   (long)(this->weight_xc_data).data);
                m_2.c = (this->weight_xc_data).d;
                m_2.elempack = (this->weight_xc_data).elempack;
                m_2.allocator = (this->weight_xc_data).allocator;
                m_2.refcount = (int *)0x0;
                m_2.d = 1;
                iVar1 = (this->weight_xc_data).dims;
                m_2.dims = iVar1 + -1;
                m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                            m_2.elemsize;
                if (iVar1 == 4) {
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                }
                m_3.w = (this->bias_c_data).w;
                m_3.h = (this->bias_c_data).h;
                uVar5 = (this->bias_c_data).elemsize;
                m_3.data = (void *)((this->bias_c_data).cstep * uVar5 +
                                   (long)(this->bias_c_data).data);
                m_3.elempack = (this->bias_c_data).elempack;
                m_3.allocator = (this->bias_c_data).allocator;
                m_3.refcount._0_4_ = 0;
                m_3.refcount._4_4_ = 0;
                m_3.elemsize._0_4_ = (undefined4)uVar5;
                m_3.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
                m_3.c = (this->bias_c_data).d;
                m_3.d = 1;
                iVar1 = (this->bias_c_data).dims;
                m_3.dims = iVar1 + -1;
                m_3.cstep = (uVar5 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar5;
                if (iVar1 == 4) {
                  m_3.cstep = (long)m_3.h * (long)m_3.w;
                }
                m_10.w = (this->weight_hc_data).w;
                m_10.h = (this->weight_hc_data).h;
                m_10.elemsize = (this->weight_hc_data).elemsize;
                m_10.data = (void *)((this->weight_hc_data).cstep * m_10.elemsize +
                                    (long)(this->weight_hc_data).data);
                m_10.c = (this->weight_hc_data).d;
                m_10.elempack = (this->weight_hc_data).elempack;
                m_10.allocator = (this->weight_hc_data).allocator;
                m_10.refcount = (int *)0x0;
                m_10.d = 1;
                iVar1 = (this->weight_hc_data).dims;
                m_10.dims = iVar1 + -1;
                m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0
                             ) / m_10.elemsize;
                if (iVar1 == 4) {
                  m_10.cstep = (long)m_10.h * (long)m_10.w;
                }
                if (this->num_output == this->hidden_size) {
                  m_11.cstep = 0;
                  m_11.data = (void *)0x0;
                  m_11.elemsize._0_4_ = 0;
                  m_11.elemsize._4_4_ = 0;
                  m_11.elempack = 0;
                  m_11.allocator = (Allocator *)0x0;
                  m_11.dims = 0;
                  m_11.w = 0;
                  m_11.h = 0;
                  m_11.d = 0;
                  m_11.c = 0;
                }
                else {
                  m_11.w = (this->weight_hr_data).w;
                  m_11.h = (this->weight_hr_data).h;
                  uVar5 = (this->weight_hr_data).elemsize;
                  m_11.data = (void *)((this->weight_hr_data).cstep * uVar5 +
                                      (long)(this->weight_hr_data).data);
                  m_11.elempack = (this->weight_hr_data).elempack;
                  m_11.allocator = (this->weight_hr_data).allocator;
                  m_11.elemsize._0_4_ = (undefined4)uVar5;
                  m_11.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
                  m_11.c = (this->weight_hr_data).d;
                  m_11.d = 1;
                  iVar1 = (this->weight_hr_data).dims;
                  m_11.dims = iVar1 + -1;
                  m_11.cstep = (uVar5 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) /
                               uVar5;
                  if (iVar1 == 4) {
                    m_11.cstep = (long)m_11.h * (long)m_11.w;
                  }
                }
                m_11.refcount._4_4_ = 0;
                m_11.refcount._0_4_ = 0;
                iVar4 = lstm_int8(bottom_blob,&m_1,1,&m_2,
                                  (float *)((long)(this->weight_xc_data_int8_scales).w *
                                            (this->weight_xc_data_int8_scales).elemsize +
                                           (long)(this->weight_xc_data_int8_scales).data),&m_3,&m_10
                                  ,(float *)((long)(this->weight_hc_data_int8_scales).w *
                                             (this->weight_hc_data_int8_scales).elemsize +
                                            (long)(this->weight_hc_data_int8_scales).data),&m_11,
                                  &local_78,&local_c8,opt);
              }
              if (iVar4 != 0) goto LAB_00320ee7;
              iVar4 = 0;
              uVar5 = (ulong)_h;
              if ((int)_h < 1) {
                uVar5 = 0;
              }
              for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
                __src = (void *)((long)m_1.w * uVar7 *
                                 CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                (long)m_1.data);
                __dest = (void *)((long)top_blob->w * uVar7 * top_blob->elemsize +
                                 (long)top_blob->data);
                memcpy(__dest,(void *)((long)m.w * uVar7 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),(long)this->num_output << 2);
                memcpy((void *)((long)this->num_output * 4 + (long)__dest),__src,
                       (long)this->num_output << 2);
              }
              bVar3 = true;
            }
            piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  free(m_1.data);
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                free(m.data);
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (!bVar3) goto LAB_003202fd;
        }
        iVar4 = 0;
      }
    }
  }
LAB_003202fd:
  piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00320334:
  piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int LSTM::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    Mat cell(hidden_size, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;
    cell.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = lstm_int8(bottom_blob, top_blob, direction, weight_xc_data.channel(0), weight_xc_data_int8_scales.row(0), bias_c_data.channel(0), weight_hc_data.channel(0), weight_hc_data_int8_scales.row(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = lstm_int8(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), weight_xc_data_int8_scales.row(0), bias_c_data.channel(0), weight_hc_data.channel(0), weight_hc_data_int8_scales.row(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }

        hidden.fill(0.0f);
        cell.fill(0.0f);

#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = lstm_int8(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), weight_xc_data_int8_scales.row(1), bias_c_data.channel(1), weight_hc_data.channel(1), weight_hc_data_int8_scales.row(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}